

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::_abi_1_10::Formatter::formatNodeList
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *begin,
                BaseNode *end)

{
  Error EVar1;
  
  if (begin != end) {
    do {
      EVar1 = formatNode(sb,formatOptions,builder,begin);
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = String::_opChar(sb,kAppend,'\n');
      if (EVar1 != 0) {
        return EVar1;
      }
      begin = (begin->field_0).field_0._next;
    } while (begin != end);
  }
  return 0;
}

Assistant:

Error formatNodeList(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* begin,
  const BaseNode* end) noexcept {

  const BaseNode* node = begin;
  while (node != end) {
    ASMJIT_PROPAGATE(formatNode(sb, formatOptions, builder, node));
    ASMJIT_PROPAGATE(sb.append('\n'));
    node = node->next();
  }
  return kErrorOk;
}